

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_NewScopeObjectWithFormals
              (ScriptContext *scriptContext,FunctionBody *calleeBody,bool nonSimpleParamList)

{
  bool bVar1;
  int oldCount;
  int newCount;
  ThreadContext *threadContext;
  DynamicObject *this;
  DynamicType *pDVar2;
  PropertyIdArray *pPVar3;
  DynamicTypeHandler *pDVar4;
  int newSlotCapacity;
  int oldSlotCapacity;
  DynamicType *newType;
  ActivationObject *frameObject;
  JsReentLock reentrancylock;
  bool nonSimpleParamList_local;
  FunctionBody *calleeBody_local;
  ScriptContext *scriptContext_local;
  
  reentrancylock._31_1_ = nonSimpleParamList;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&frameObject,threadContext);
  this = (DynamicObject *)OP_NewScopeObject(scriptContext);
  if ((reentrancylock._31_1_ & 1) == 0) {
    pDVar2 = DynamicObject::GetDynamicType(this);
    pPVar3 = FunctionBody::GetFormalsPropIdArray(calleeBody,true);
    _newSlotCapacity =
         PathTypeHandlerBase::CreateNewScopeObject<false>
                   (scriptContext,pDVar2,pPVar3,'\0',0xffffffff);
  }
  else {
    bVar1 = FunctionBody::HasReferenceableBuiltInArguments(calleeBody);
    if (bVar1) {
      pDVar2 = DynamicObject::GetDynamicType(this);
      pPVar3 = FunctionBody::GetFormalsPropIdArray(calleeBody,true);
      _newSlotCapacity =
           PathTypeHandlerBase::CreateNewScopeObject<true>
                     (scriptContext,pDVar2,pPVar3,'G',0xffffffff);
    }
    else {
      pDVar2 = DynamicObject::GetDynamicType(this);
      pPVar3 = FunctionBody::GetFormalsPropIdArray(calleeBody,true);
      _newSlotCapacity =
           PathTypeHandlerBase::CreateNewScopeObject<false>
                     (scriptContext,pDVar2,pPVar3,'G',0xffffffff);
    }
  }
  pDVar2 = DynamicObject::GetDynamicType(this);
  pDVar4 = DynamicType::GetTypeHandler(pDVar2);
  oldCount = DynamicTypeHandler::GetSlotCapacity(pDVar4);
  pDVar4 = DynamicType::GetTypeHandler(_newSlotCapacity);
  newCount = DynamicTypeHandler::GetSlotCapacity(pDVar4);
  pDVar4 = DynamicType::GetTypeHandler(_newSlotCapacity);
  DynamicObject::EnsureSlots(this,oldCount,newCount,scriptContext,pDVar4);
  DynamicObject::ReplaceType(this,_newSlotCapacity);
  JsReentLock::~JsReentLock((JsReentLock *)&frameObject);
  return this;
}

Assistant:

Var JavascriptOperators::OP_NewScopeObjectWithFormals(ScriptContext* scriptContext, FunctionBody * calleeBody, bool nonSimpleParamList)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_NewScopeObjectWithFormals, reentrancylock, scriptContext->GetThreadContext());
        Js::ActivationObject * frameObject = (ActivationObject*)OP_NewScopeObject(scriptContext);
        // No fixed fields for formal parameters of the arguments object.  Also, mark all fields as initialized up-front, because
        // we will set them directly using SetSlot below, so the type handler will not have a chance to mark them as initialized later.
        // CONSIDER : When we delay type sharing until the second instance is created, pass an argument indicating we want the types
        // and handlers created here to be marked as shared up-front. This is to ensure we don't get any fixed fields and that the handler
        // is ready for storing values directly to slots.
        DynamicType* newType = nullptr;
        if (nonSimpleParamList)
        {
            if (calleeBody->HasReferenceableBuiltInArguments())
            {
                newType = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, frameObject->GetDynamicType(), calleeBody->GetFormalsPropIdArray(), PropertyLetDefaults);
            }
            else
            {
                newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), calleeBody->GetFormalsPropIdArray(), PropertyLetDefaults);
            }
        }
        else
        {
            newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), calleeBody->GetFormalsPropIdArray());
        }

        int oldSlotCapacity = frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity();
        int newSlotCapacity = newType->GetTypeHandler()->GetSlotCapacity();

        frameObject->EnsureSlots(oldSlotCapacity, newSlotCapacity, scriptContext, newType->GetTypeHandler());
        frameObject->ReplaceType(newType);

        return frameObject;
        JIT_HELPER_END(OP_NewScopeObjectWithFormals);
    }